

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger base_setconsttable(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQRESULT SVar2;
  SQInteger SVar3;
  SQObjectPtr o;
  SQObjectPtr local_20;
  
  local_20.super_SQObject._type = (v->_sharedstate->_consts).super_SQObject._type;
  local_20.super_SQObject._unVal =
       (SQObjectValue)(v->_sharedstate->_consts).super_SQObject._unVal.pTable;
  if ((local_20.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_20.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SVar2 = sq_setconsttable(v);
  if (SVar2 < 0) {
    SVar3 = -1;
  }
  else {
    SVar3 = 1;
    SQVM::Push(v,&local_20);
  }
  SQObjectPtr::~SQObjectPtr(&local_20);
  return SVar3;
}

Assistant:

static SQInteger base_setconsttable(HSQUIRRELVM v)
{
    SQObjectPtr o = _ss(v)->_consts;
    if(SQ_FAILED(sq_setconsttable(v))) return SQ_ERROR;
    v->Push(o);
    return 1;
}